

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_lightning_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  act("$n breathes a bolt of lightning at $N.",ch,(void *)0x0,vo,1);
  act("$n breathes a bolt of lightning at you!",ch,(void *)0x0,vo,2);
  act("You breathe a bolt of lightning at $N.",ch,(void *)0x0,vo,3);
  iVar3 = ch->hit;
  iVar2 = dice(level,5);
  iVar2 = iVar2 + iVar3 / 9;
  if (ch->hit <= iVar2) {
    iVar2 = ch->hit;
  }
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,6);
  if (bVar1) {
    iVar3 = iVar2 + 3;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    shock_effect(vo,level / 2,iVar3 >> 2,0);
    iVar2 = iVar2 / 2;
  }
  else {
    shock_effect(vo,level,iVar2,0);
  }
  damage_old(ch,(CHAR_DATA *)vo,iVar2,sn,6,true);
  return;
}

Assistant:

void spell_lightning_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam, hp_dam, dice_dam, hpch;

	act("$n breathes a bolt of lightning at $N.", ch, nullptr, victim, TO_NOTVICT);
	act("$n breathes a bolt of lightning at you!", ch, nullptr, victim, TO_VICT);
	act("You breathe a bolt of lightning at $N.", ch, nullptr, victim, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 5);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = 0;

	/*
		hpch = std::max(10,ch->hit);
		hp_dam = number_range(hpch/9+1,hpch/5);
		dice_dam = dice(level,20);

		dam = std::max(hp_dam + dice_dam/10,dice_dam + hp_dam/10);
	*/

	if (saves_spell(level, victim, DAM_LIGHTNING))
	{
		shock_effect(victim, level / 2, dam / 4, TARGET_CHAR);
		damage_old(ch, victim, dam / 2, sn, DAM_LIGHTNING, true);
	}
	else
	{
		shock_effect(victim, level, dam, TARGET_CHAR);
		damage_old(ch, victim, dam, sn, DAM_LIGHTNING, true);
	}
}